

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdSetRawReissueAsset
              (void *handle,char *tx_hex_string,char *txid,uint32_t vout,int64_t asset_amount,
              char *blinding_nonce,char *entropy,char *address,char *direct_locking_script,
              char **asset_string,char **tx_string)

{
  initializer_list<cfd::api::TxInReissuanceParameters> __l;
  bool bVar1;
  undefined8 uVar2;
  reference pvVar3;
  vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_> *this;
  undefined4 in_ECX;
  char *in_RDX;
  char *in_RSI;
  int64_t in_R8;
  char *in_R9;
  Amount AVar4;
  char *in_stack_00000008;
  char *in_stack_00000010;
  char *in_stack_00000018;
  undefined8 *in_stack_00000020;
  undefined8 *in_stack_00000028;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionController ctxc;
  vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>
  issuances;
  vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_> outputs;
  ElementsTransactionApi api;
  TxInReissuanceParameters params;
  Script script;
  Address unblind_addr;
  ElementsConfidentialAddress confidential_addr;
  string addr;
  ElementsAddressFactory address_factory;
  Amount amount;
  ConfidentialTxOut asset_txout;
  char *work_tx_string;
  char *work_asset_string;
  AbstractTransactionController *in_stack_ffffffffffffefc8;
  ElementsConfidentialAddress *in_stack_ffffffffffffefd0;
  AddressFactory *in_stack_ffffffffffffefd8;
  string *in_stack_ffffffffffffefe0;
  CfdError in_stack_ffffffffffffefec;
  TxInReissuanceParameters *in_stack_ffffffffffffeff0;
  TxInReissuanceParameters *in_stack_ffffffffffffeff8;
  TxInReissuanceParameters *in_stack_fffffffffffff000;
  iterator in_stack_fffffffffffff008;
  size_type in_stack_fffffffffffff010;
  string *message;
  string **local_fc8;
  string local_ed0 [32];
  string local_eb0;
  allocator local_e89;
  string local_e88 [56];
  vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_>
  *in_stack_fffffffffffff1b0;
  vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>
  *in_stack_fffffffffffff1b8;
  string *in_stack_fffffffffffff1c0;
  ElementsTransactionApi *in_stack_fffffffffffff1c8;
  string local_e08 [11];
  string *local_c98;
  undefined8 local_c90;
  vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_> local_c70;
  ElementsTransactionApi local_c52;
  allocator local_c51;
  string local_c50;
  BlindFactor local_c30;
  allocator local_c09;
  string local_c08;
  BlindFactor local_be8;
  allocator local_bc1;
  string local_bc0;
  Txid local_ba0;
  Txid local_b80;
  undefined4 local_b60;
  int64_t local_b58;
  undefined1 local_b50;
  ConfidentialTxOut local_b48;
  BlindFactor local_a50;
  BlindFactor local_a30;
  ConfidentialValue local_a10;
  ConfidentialAssetId local_9e8;
  ConfidentialTxOut local_9c0;
  allocator local_8c1;
  string local_8c0;
  Script local_8a0;
  ConfidentialAssetId local_868;
  ConfidentialTxOut local_840;
  Address local_748;
  ConfidentialAssetId local_5d0;
  ConfidentialTxOut local_5a8;
  ElementsConfidentialAddress local_4b0;
  allocator local_2f9;
  string local_2f8 [2];
  int64_t local_2b0;
  undefined1 local_2a8;
  Amount local_2a0;
  ConfidentialTxOut local_290;
  undefined1 local_192;
  allocator local_191;
  string local_190 [32];
  CfdSourceLocation local_170;
  undefined1 local_152;
  allocator local_151;
  string local_150 [32];
  CfdSourceLocation local_130;
  undefined1 local_112;
  allocator local_111;
  string local_110 [32];
  CfdSourceLocation local_f0;
  undefined1 local_d2;
  allocator local_d1;
  string local_d0 [32];
  CfdSourceLocation local_b0;
  undefined1 local_92;
  allocator local_91;
  string local_90 [32];
  CfdSourceLocation local_70;
  vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_> *local_48;
  char *local_40;
  char *local_38;
  int64_t local_30;
  undefined4 local_24;
  char *local_20;
  char *local_18;
  int local_4;
  
  local_40 = (char *)0x0;
  local_48 = (vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_> *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_70.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_70.filename = local_70.filename + 1;
    local_70.line = 0x3c1;
    local_70.funcname = "CfdSetRawReissueAsset";
    cfd::core::logger::warn<>(&local_70,"tx is null or empty.");
    local_92 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"Failed to parameter. tx is null or empty.",&local_91);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_ffffffffffffeff0,in_stack_ffffffffffffefec,
               in_stack_ffffffffffffefe0);
    local_92 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (in_stack_00000028 == (undefined8 *)0x0) {
    local_b0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_b0.filename = local_b0.filename + 1;
    local_b0.line = 0x3c7;
    local_b0.funcname = "CfdSetRawReissueAsset";
    cfd::core::logger::warn<>(&local_b0,"tx is null.");
    local_d2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"Failed to parameter. output tx is null.",&local_d1);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_ffffffffffffeff0,in_stack_ffffffffffffefec,
               in_stack_ffffffffffffefe0);
    local_d2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_f0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_f0.filename = local_f0.filename + 1;
    local_f0.line = 0x3cd;
    local_f0.funcname = "CfdSetRawReissueAsset";
    cfd::core::logger::warn<>(&local_f0,"txid is null or empty.");
    local_112 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"Failed to parameter. txid is null or empty.",&local_111)
    ;
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_ffffffffffffeff0,in_stack_ffffffffffffefec,
               in_stack_ffffffffffffefe0);
    local_112 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_38);
  if (bVar1) {
    local_130.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_130.filename = local_130.filename + 1;
    local_130.line = 0x3d3;
    local_130.funcname = "CfdSetRawReissueAsset";
    cfd::core::logger::warn<>(&local_130,"blinding nonce is null or empty.");
    local_152 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_150,"Failed to parameter. blinding nonce is null or empty.",&local_151);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_ffffffffffffeff0,in_stack_ffffffffffffefec,
               in_stack_ffffffffffffefe0);
    local_152 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(in_stack_00000008);
  if (bVar1) {
    local_170.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_170.filename = local_170.filename + 1;
    local_170.line = 0x3d9;
    local_170.funcname = "CfdSetRawReissueAsset";
    cfd::core::logger::warn<>(&local_170,"entropy is null or empty.");
    local_192 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_190,"Failed to parameter. entropy is null or empty.",&local_191);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_ffffffffffffeff0,in_stack_ffffffffffffefec,
               in_stack_ffffffffffffefe0);
    local_192 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::ConfidentialTxOut::ConfidentialTxOut(&local_290);
  AVar4 = cfd::core::Amount::CreateBySatoshiAmount(local_30);
  local_2b0 = AVar4.amount_;
  local_2a8 = AVar4.ignore_check_;
  local_2a0.amount_ = local_2b0;
  local_2a0.ignore_check_ = (bool)local_2a8;
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)in_stack_fffffffffffff000);
  bVar1 = cfd::capi::IsEmptyString(in_stack_00000010);
  if (bVar1) {
    bVar1 = cfd::capi::IsEmptyString(in_stack_00000018);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_8c0,in_stack_00000018,&local_8c1);
      cfd::core::Script::Script(&local_8a0,&local_8c0);
      std::__cxx11::string::~string((string *)&local_8c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_8c1);
      cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_9e8);
      cfd::core::ConfidentialValue::ConfidentialValue(&local_a10,&local_2a0);
      cfd::core::ConfidentialTxOut::ConfidentialTxOut(&local_9c0,&local_8a0,&local_9e8,&local_a10);
      cfd::core::ConfidentialTxOut::operator=(&local_290,&local_9c0);
      cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&local_9c0);
      cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x5abff7);
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x5ac004);
      cfd::core::Script::~Script((Script *)in_stack_ffffffffffffefd0);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_2f8,in_stack_00000010,&local_2f9);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
    bVar1 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(local_2f8);
    if (bVar1) {
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_4b0,local_2f8);
      cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_5d0);
      cfd::core::ConfidentialTxOut::ConfidentialTxOut(&local_5a8,&local_4b0,&local_5d0,&local_2a0);
      cfd::core::ConfidentialTxOut::operator=(&local_290,&local_5a8);
      cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&local_5a8);
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x5abccc);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                (in_stack_ffffffffffffefd0);
    }
    else {
      cfd::AddressFactory::GetAddress(in_stack_ffffffffffffefd8,(string *)in_stack_ffffffffffffefd0)
      ;
      cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_868);
      cfd::core::ConfidentialTxOut::ConfidentialTxOut(&local_840,&local_748,&local_868,&local_2a0);
      cfd::core::ConfidentialTxOut::operator=(&local_290,&local_840);
      cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&local_840);
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x5abe41);
      cfd::core::Address::~Address(&in_stack_ffffffffffffefd0->unblinded_address_);
    }
    std::__cxx11::string::~string((string *)local_2f8);
  }
  cfd::api::TxInReissuanceParameters::TxInReissuanceParameters(in_stack_ffffffffffffeff0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_bc0,local_20,&local_bc1);
  cfd::core::Txid::Txid(&local_ba0,&local_bc0);
  cfd::core::Txid::operator=(&local_b80,&local_ba0);
  cfd::core::Txid::~Txid((Txid *)0x5ac17e);
  std::__cxx11::string::~string((string *)&local_bc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bc1);
  local_b60 = local_24;
  local_b50 = local_2a0.ignore_check_;
  local_b58 = local_2a0.amount_;
  cfd::core::ConfidentialTxOut::operator=(&local_b48,&local_290);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c08,local_38,&local_c09);
  cfd::core::BlindFactor::BlindFactor(&local_be8,&local_c08);
  cfd::core::BlindFactor::operator=(&local_a50,&local_be8);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x5ac25a);
  std::__cxx11::string::~string((string *)&local_c08);
  std::allocator<char>::~allocator((allocator<char> *)&local_c09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c50,in_stack_00000008,&local_c51);
  cfd::core::BlindFactor::BlindFactor(&local_c30,&local_c50);
  cfd::core::BlindFactor::operator=(&local_a30,&local_c30);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x5ac2f3);
  std::__cxx11::string::~string((string *)&local_c50);
  std::allocator<char>::~allocator((allocator<char> *)&local_c51);
  cfd::api::ElementsTransactionApi::ElementsTransactionApi(&local_c52);
  std::vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_>::vector
            ((vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_> *)0x5ac329
            );
  cfd::api::TxInReissuanceParameters::TxInReissuanceParameters
            (in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
  local_c98 = local_e08;
  local_c90 = 1;
  std::allocator<cfd::api::TxInReissuanceParameters>::allocator
            ((allocator<cfd::api::TxInReissuanceParameters> *)0x5ac376);
  __l._M_len = in_stack_fffffffffffff010;
  __l._M_array = in_stack_fffffffffffff008;
  std::
  vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>::
  vector((vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>
          *)in_stack_fffffffffffff000,__l,(allocator_type *)in_stack_ffffffffffffeff8);
  std::allocator<cfd::api::TxInReissuanceParameters>::~allocator
            ((allocator<cfd::api::TxInReissuanceParameters> *)0x5ac3a7);
  message = local_e08;
  local_fc8 = &local_c98;
  do {
    local_fc8 = local_fc8 + -0x2e;
    cfd::api::TxInReissuanceParameters::~TxInReissuanceParameters
              ((TxInReissuanceParameters *)in_stack_ffffffffffffefd0);
  } while ((string *)local_fc8 != message);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e88,local_18,&local_e89);
  cfd::api::ElementsTransactionApi::SetRawReissueAsset
            (in_stack_fffffffffffff1c8,in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,
             in_stack_fffffffffffff1b0);
  std::__cxx11::string::~string(local_e88);
  std::allocator<char>::~allocator((allocator<char> *)&local_e89);
  bVar1 = std::vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_>::empty
                    ((vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_> *)
                     in_stack_ffffffffffffefe0);
  if ((!bVar1) && (in_stack_00000020 != (undefined8 *)0x0)) {
    pvVar3 = std::vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_>::
             operator[](&local_c70,0);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_eb0,&(pvVar3->output).asset);
    local_40 = cfd::capi::CreateString(message);
    std::__cxx11::string::~string((string *)&local_eb0);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_(in_stack_ffffffffffffefc8);
  this = (vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_> *)
         cfd::capi::CreateString(message);
  local_48 = this;
  std::__cxx11::string::~string(local_ed0);
  if (local_40 != (char *)0x0) {
    *in_stack_00000020 = local_40;
  }
  *in_stack_00000028 = local_48;
  local_4 = 0;
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)in_stack_ffffffffffffefd0);
  std::
  vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>::
  ~vector((vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>
           *)this);
  std::vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_>::~vector(this);
  cfd::api::TxInReissuanceParameters::~TxInReissuanceParameters
            ((TxInReissuanceParameters *)in_stack_ffffffffffffefd0);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x5ac87c);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&local_290);
  return local_4;
}

Assistant:

int CfdSetRawReissueAsset(
    void* handle, const char* tx_hex_string, const char* txid, uint32_t vout,
    int64_t asset_amount, const char* blinding_nonce, const char* entropy,
    const char* address, const char* direct_locking_script,
    char** asset_string, char** tx_string) {
  char* work_asset_string = nullptr;
  char* work_tx_string = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output tx is null.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(blinding_nonce)) {
      warn(CFD_LOG_SOURCE, "blinding nonce is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. blinding nonce is null or empty.");
    }
    if (IsEmptyString(entropy)) {
      warn(CFD_LOG_SOURCE, "entropy is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. entropy is null or empty.");
    }

    ConfidentialTxOut asset_txout;
    Amount amount = Amount::CreateBySatoshiAmount(asset_amount);
    ElementsAddressFactory address_factory;
    if (!IsEmptyString(address)) {
      std::string addr(address);
      if (ElementsConfidentialAddress::IsConfidentialAddress(addr)) {
        ElementsConfidentialAddress confidential_addr(addr);
        asset_txout = ConfidentialTxOut(
            confidential_addr, ConfidentialAssetId(), amount);
      } else {
        Address unblind_addr = address_factory.GetAddress(addr);
        asset_txout =
            ConfidentialTxOut(unblind_addr, ConfidentialAssetId(), amount);
      }
    } else if (!IsEmptyString(direct_locking_script)) {
      Script script(direct_locking_script);
      asset_txout = ConfidentialTxOut(
          script, ConfidentialAssetId(), ConfidentialValue(amount));
    }

    TxInReissuanceParameters params;
    params.txid = Txid(std::string(txid));
    params.vout = vout;
    params.amount = amount;
    params.asset_txout = asset_txout;
    params.blind_factor = BlindFactor(std::string(blinding_nonce));
    params.entropy = BlindFactor(std::string(entropy));

    ElementsTransactionApi api;
    std::vector<IssuanceOutput> outputs;
    std::vector<TxInReissuanceParameters> issuances{params};
    ConfidentialTransactionController ctxc =
        api.SetRawReissueAsset(tx_hex_string, issuances, &outputs);

    if (!outputs.empty() && (asset_string != nullptr)) {
      work_asset_string = CreateString(outputs[0].output.asset.GetHex());
    }
    work_tx_string = CreateString(ctxc.GetHex());

    if (work_asset_string != nullptr) *asset_string = work_asset_string;
    *tx_string = work_tx_string;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(&work_asset_string, &work_tx_string);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(&work_asset_string, &work_tx_string);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(&work_asset_string, &work_tx_string);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}